

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)5>_>_>
 wabt::MakeUnique<wabt::AssertModuleCommand<(wabt::CommandType)5>>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)5>_>,_true,_true>
  in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x38);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  *(undefined4 *)(puVar1 + 1) = 5;
  *puVar1 = &PTR__AssertModuleCommand_001c1528;
  puVar1[3] = puVar1 + 5;
  *(undefined1 *)(puVar1 + 5) = 0;
  *(undefined8 **)
   in_RDI.
   super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)5>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)5>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)5>_>_>
   .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)5>_*,_false>._M_head_impl =
       puVar1;
  return (__uniq_ptr_data<wabt::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)5>_>,_true,_true>
          )(tuple<wabt::AssertModuleCommand<(wabt::CommandType)5>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)5>_>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)5>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)5>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)5>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)5>_>_>
             .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)5>_*,_false>.
             _M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}